

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O1

void __thiscall CommandBlock::Launch(CommandBlock *this)

{
  int iVar1;
  Process *this_00;
  string_type local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  Config local_58;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  
  iVar1 = (*(this->super_Block)._vptr_Block[4])();
  if ((char)iVar1 != '\0') {
    (*(this->super_Block)._vptr_Block[3])(this);
  }
  (this->consoleOutput)._M_string_length = 0;
  *(this->consoleOutput)._M_dataplus._M_p = '\0';
  this_00 = (Process *)operator_new(0xd8);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<void_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/pipeline.hpp:44:20)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/pipeline.hpp:44:20)>
             ::_M_manager;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_58.buffer_size = 0x20000;
  local_58.inherit_file_descriptors = false;
  local_58._9_7_ = 0;
  local_78._M_unused._M_object = this;
  TinyProcessLib::Process::Process
            (this_00,&this->command,&local_98,
             (function<void_(const_char_*,_unsigned_long)> *)&local_78,
             (function<void_(const_char_*,_unsigned_long)> *)&local_48,false,&local_58);
  this->process = this_00;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  puts((this->command)._M_dataplus._M_p);
  return;
}

Assistant:

virtual void Launch() override
    {
        if (IsRunning())
        {
            Stop();
        }
        consoleOutput.clear();
        auto clb = [this](const char *bytes, size_t n) {
            consoleOutput += std::string(bytes, n);
        };
        process = new Process(command, "", clb);
        printf("%s\n", command.c_str());
    }